

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

void Curl_ssl_easy_config_init(Curl_easy *data)

{
  Curl_easy *data_local;
  
  (data->set).ssl.primary.field_0x79 = (data->set).ssl.primary.field_0x79 & 0xfe | 1;
  (data->set).ssl.primary.field_0x79 = (data->set).ssl.primary.field_0x79 & 0xfd | 2;
  (data->set).ssl.primary.field_0x79 = (data->set).ssl.primary.field_0x79 & 0xf7 | 8;
  memcpy(&(data->set).proxy_ssl,&(data->set).ssl,200);
  return;
}

Assistant:

void Curl_ssl_easy_config_init(struct Curl_easy *data)
{
  /*
   * libcurl 7.10 introduced SSL verification *by default*! This needs to be
   * switched off unless wanted.
   */
  data->set.ssl.primary.verifypeer = TRUE;
  data->set.ssl.primary.verifyhost = TRUE;
  data->set.ssl.primary.cache_session = TRUE; /* caching by default */
#ifndef CURL_DISABLE_PROXY
  data->set.proxy_ssl = data->set.ssl;
#endif
}